

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int tcache_create_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  ulong uVar1;
  _Bool _Var2;
  base_t *base;
  size_t __n;
  uint local_1c;
  
  if (newp != (void *)0x0 || newlen != 0) {
    return 1;
  }
  if (oldlenp == (size_t *)0x0 || oldp == (void *)0x0) {
    if (oldlenp == (size_t *)0x0) {
      return 0x16;
    }
  }
  else if (*oldlenp == 4) {
    base = duckdb_je_b0get();
    _Var2 = duckdb_je_tcaches_create(tsd,base,&local_1c);
    if (_Var2) {
      return 0xe;
    }
    uVar1 = *oldlenp;
    if (uVar1 != 4) {
      __n = 4;
      if (uVar1 < 4) {
        __n = uVar1;
      }
      switchD_00b041bd::default(oldp,&local_1c,__n);
      *oldlenp = __n;
      return 0x16;
    }
    *(uint *)oldp = local_1c;
    return 0;
  }
  *oldlenp = 0;
  return 0x16;
}

Assistant:

static int
tcache_create_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned tcache_ind;

	READONLY();
	VERIFY_READ(unsigned);
	if (tcaches_create(tsd, b0get(), &tcache_ind)) {
		ret = EFAULT;
		goto label_return;
	}
	READ(tcache_ind, unsigned);

	ret = 0;
label_return:
	return ret;
}